

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::cmdline_error::~cmdline_error(cmdline_error *this)

{
  cmdline_error *this_local;
  
  ~cmdline_error(this);
  operator_delete(this);
  return;
}

Assistant:

~cmdline_error() throw() {}